

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leb128.cc
# Opt level: O1

void wabt::WriteS32Leb128(Stream *stream,uint32_t value,char *desc)

{
  size_t sVar1;
  size_t size;
  ulong uVar2;
  byte bVar3;
  bool bVar4;
  uint8_t data [5];
  byte local_5 [5];
  
  if ((int)value < 0) {
    size = 0;
    do {
      bVar4 = (value & 0x40) == 0 || (int)value >> 7 != 0xffffffff;
      local_5[size] = bVar4 << 7 | (byte)value & 0x7f;
      size = size + 1;
      value = (int)value >> 7;
    } while (bVar4);
  }
  else {
    uVar2 = (ulong)value;
    sVar1 = 0;
    do {
      uVar2 = uVar2 >> 7;
      bVar3 = (byte)value | 0x80;
      if (value < 0x40) {
        bVar3 = (byte)value;
      }
      size = sVar1 + 1;
      local_5[sVar1] = bVar3;
      bVar4 = 0x3f < value;
      sVar1 = size;
      value = (uint)uVar2;
    } while (bVar4);
  }
  Stream::WriteData(stream,local_5,size,desc,No);
  return;
}

Assistant:

void WriteS32Leb128(Stream* stream, uint32_t value, const char* desc) {
  WriteS32Leb128(stream, Bitcast<int32_t>(value), desc);
}